

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_reverb.c
# Opt level: O2

uint32_t FAPOFXCreateReverb(FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                           FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                           FAudioReallocFunc customRealloc,uint8_t legacy)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  ulong uVar1;
  FAPORegistrationProperties *pRegistrationProperties;
  uint8_t *puVar2;
  FAPOFXReverbParameters fxdefault;
  
  fxdefault.Diffusion = 0.9;
  fxdefault.RoomSize = 0.6;
  fapo = (FAPOBase *)(*customMalloc)(0xe0);
  pParameterBlocks = (uint8_t *)(*customMalloc)(0x18);
  if (pInitData == (void *)0x0) {
    SDL_memset(pParameterBlocks,0,0x18);
    pInitData = &fxdefault;
    uVar1 = 8;
    SDL_memcpy(pParameterBlocks,pInitData,8);
    SDL_memcpy(pParameterBlocks + 8,pInitData,8);
    puVar2 = pParameterBlocks + 0x10;
  }
  else {
    uVar1 = (ulong)InitDataByteSize;
    SDL_memcpy(pParameterBlocks,pInitData,uVar1);
    SDL_memcpy(pParameterBlocks + uVar1,pInitData,uVar1);
    puVar2 = pParameterBlocks + InitDataByteSize * 2;
  }
  SDL_memcpy(puVar2,pInitData,uVar1);
  pRegistrationProperties = &FXReverbProperties_LEGACY;
  SDL_memcpy(&FXReverbProperties_LEGACY,&FAPOFX_CLSID_FXReverb_LEGACY,0x10);
  SDL_memcpy(&FXReverbProperties,&FAPOFX_CLSID_FXReverb,0x10);
  if (legacy == '\0') {
    pRegistrationProperties = &FXReverbProperties;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,8,'\0',customMalloc,customFree,
             customRealloc);
  (fapo->base).Initialize = FAPOFXReverb_Initialize;
  (fapo->base).Process = FAPOFXReverb_Process;
  fapo->Destructor = FAPOFXReverb_Free;
  *pEffect = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateReverb(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXReverbParameters fxdefault =
	{
		FAPOFXREVERB_DEFAULT_DIFFUSION,
		FAPOFXREVERB_DEFAULT_ROOMSIZE,
	};

	/* Allocate... */
	FAPOFXReverb *result = (FAPOFXReverb*) customMalloc(
		sizeof(FAPOFXReverb)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXReverbParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXReverbParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXReverbParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXReverbParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXReverbParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXReverbProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXReverb_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXReverbProperties.clsid,
		&FAPOFX_CLSID_FXReverb,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXReverbProperties_LEGACY : &FXReverbProperties,
		params,
		sizeof(FAPOFXReverbParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXReverb_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXReverb_Process;
	result->base.Destructor = FAPOFXReverb_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}